

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbfgsb.hpp
# Opt level: O3

int __thiscall lbfgsb::Optimizer::init(Optimizer *this,EVP_PKEY_CTX *ctx)

{
  pointer __s;
  pointer pdVar1;
  pointer __s_00;
  pointer piVar2;
  
  __s = (this->wa).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  pdVar1 = (this->wa).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != pdVar1) {
    memset(__s,0,((long)pdVar1 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  __s_00 = (this->iwa).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar2 = (this->iwa).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (__s_00 != piVar2) {
    memset(__s_00,0,((long)piVar2 + (-4 - (long)__s_00) & 0xfffffffffffffffcU) + 4);
  }
  memset(this->dsave,0,0xe8);
  memset(this->lsave,0,0xb4);
  this->task[0] = ' ';
  this->task[1] = ' ';
  this->task[2] = ' ';
  this->task[3] = ' ';
  this->task[4] = ' ';
  this->task[5] = ' ';
  this->task[6] = ' ';
  this->task[7] = ' ';
  this->task[8] = ' ';
  this->task[9] = ' ';
  this->task[10] = ' ';
  this->task[0xb] = ' ';
  this->task[0xc] = ' ';
  this->task[0xd] = ' ';
  this->task[0xe] = ' ';
  this->task[0xf] = ' ';
  this->task[0x10] = ' ';
  this->task[0x11] = ' ';
  this->task[0x12] = ' ';
  this->task[0x13] = ' ';
  this->task[0x14] = ' ';
  this->task[0x15] = ' ';
  this->task[0x16] = ' ';
  this->task[0x17] = ' ';
  this->task[0x18] = ' ';
  this->task[0x19] = ' ';
  this->task[0x1a] = ' ';
  this->task[0x1b] = ' ';
  this->task[0x1c] = ' ';
  this->task[0x1d] = ' ';
  this->task[0x1e] = ' ';
  this->task[0x1f] = ' ';
  this->task[0x20] = ' ';
  this->task[0x21] = ' ';
  this->task[0x22] = ' ';
  this->task[0x23] = ' ';
  this->task[0x24] = ' ';
  this->task[0x25] = ' ';
  this->task[0x26] = ' ';
  this->task[0x27] = ' ';
  this->task[0x28] = ' ';
  this->task[0x29] = ' ';
  this->task[0x2a] = ' ';
  this->task[0x2b] = ' ';
  this->task[0x2c] = ' ';
  this->task[0x2d] = ' ';
  this->task[0x2e] = ' ';
  this->task[0x2f] = ' ';
  this->task[0x30] = ' ';
  this->task[0x31] = ' ';
  this->task[0x32] = ' ';
  this->task[0x33] = ' ';
  this->task[0x34] = ' ';
  this->task[0x35] = ' ';
  this->task[0x36] = ' ';
  this->task[0x37] = ' ';
  *(undefined8 *)(this->task + 0x38) = 0x2020202020202020;
  builtin_strncpy(this->csave + 4,"                                                        ",0x38);
  return 0x20202020;
}

Assistant:

void init() {
                // Fill with 0.
                std::fill(wa.begin(), wa.end(), 0);
                std::fill(iwa.begin(), iwa.end(), 0);
                std::fill_n(lsave, N_LSAVE, 0);
                std::fill_n(isave, N_ISAVE, 0);
                std::fill_n(dsave, N_DSAVE, 0);
                std::fill_n(task, N_TASK, ' ');
                std::fill_n(csave, N_CSAVE, ' ');
            }